

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pointer pcVar1;
  text *ptVar2;
  int iVar3;
  undefined8 uVar4;
  runtime_error *this;
  bool bVar5;
  undefined1 uVar6;
  _Alloc_hider _Var7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  pointer pbVar11;
  text opt;
  text val;
  text arg;
  texts in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  seed_t local_214;
  undefined8 local_210;
  int local_204;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  ulong local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  value_type local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_150;
  text local_148;
  text local_128;
  text local_108;
  text local_e8;
  text local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar11 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 1;
    local_1f8 = 0;
    uVar6 = false;
    local_210 = 0;
    uVar8 = false;
    uVar10 = false;
    local_200 = 0;
    uVar9 = false;
    local_214 = 0;
    local_1e8 = 0;
    local_1f0 = 0;
    local_1e0 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
  }
  else {
    local_204 = 1;
    bVar5 = true;
    local_1d0 = 0;
    local_1d8 = 0;
    local_1e0 = 0;
    local_1f0 = 0;
    local_1e8 = 0;
    local_214 = 0;
    local_190 = 0;
    local_200 = 0;
    local_1a0 = 0;
    local_198 = 0;
    local_210 = 0;
    local_1c8 = 0;
    local_1f8 = 0;
    local_150 = __return_storage_ptr__;
    do {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      local_1c0 = local_1b0;
      local_1b8 = 0;
      local_1b0[0] = 0;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar1,pcVar1 + pbVar11->_M_string_length);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      split_option(&local_a8,&local_c8);
      std::__cxx11::string::_M_assign((string *)&local_238);
      std::__cxx11::string::_M_assign((string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.second._M_dataplus._M_p != &local_a8.second.field_2) {
        operator_delete(local_a8.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.first._M_dataplus._M_p != &local_a8.first.field_2) {
        operator_delete(local_a8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (bVar5) {
        if (*local_238._M_dataplus._M_p != '-') {
          bVar5 = false;
          goto LAB_0010f42d;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_238);
        if (iVar3 == 0) {
          bVar5 = false;
          goto LAB_0010f442;
        }
        uVar4 = std::__cxx11::string::compare((char *)&local_238);
        if ((int)uVar4 == 0) {
LAB_0010f499:
          local_1d0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        }
        else {
          uVar4 = std::__cxx11::string::compare((char *)&local_238);
          if ((int)uVar4 == 0) goto LAB_0010f499;
          uVar4 = std::__cxx11::string::compare((char *)&local_238);
          if ((int)uVar4 == 0) {
LAB_0010f4a6:
            local_1d8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          }
          else {
            uVar4 = std::__cxx11::string::compare((char *)&local_238);
            if ((int)uVar4 == 0) goto LAB_0010f4a6;
            uVar4 = std::__cxx11::string::compare((char *)&local_238);
            if ((int)uVar4 == 0) {
LAB_0010f4af:
              local_1e0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
            else {
              uVar4 = std::__cxx11::string::compare((char *)&local_238);
              if ((int)uVar4 == 0) goto LAB_0010f4af;
              uVar4 = std::__cxx11::string::compare((char *)&local_238);
              if ((int)uVar4 == 0) {
LAB_0010f4b8:
                local_1e8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
              }
              else {
                uVar4 = std::__cxx11::string::compare((char *)&local_238);
                if ((int)uVar4 == 0) goto LAB_0010f4b8;
                uVar4 = std::__cxx11::string::compare((char *)&local_238);
                if ((int)uVar4 == 0) {
LAB_0010f4c1:
                  local_1f0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                }
                else {
                  uVar4 = std::__cxx11::string::compare((char *)&local_238);
                  if ((int)uVar4 == 0) goto LAB_0010f4c1;
                  uVar4 = std::__cxx11::string::compare((char *)&local_238);
                  if ((int)uVar4 == 0) {
LAB_0010f4cd:
                    local_1f8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                  }
                  else {
                    uVar4 = std::__cxx11::string::compare((char *)&local_238);
                    if ((int)uVar4 == 0) goto LAB_0010f4cd;
                    uVar4 = std::__cxx11::string::compare((char *)&local_238);
                    if ((int)uVar4 == 0) {
LAB_0010f4d9:
                      local_1c8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                    }
                    else {
                      uVar4 = std::__cxx11::string::compare((char *)&local_238);
                      if ((int)uVar4 == 0) goto LAB_0010f4d9;
                      uVar4 = std::__cxx11::string::compare((char *)&local_238);
                      if ((int)uVar4 == 0) {
LAB_0010f4e5:
                        local_210 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                      }
                      else {
                        uVar4 = std::__cxx11::string::compare((char *)&local_238);
                        if ((int)uVar4 == 0) goto LAB_0010f4e5;
                        uVar4 = std::__cxx11::string::compare((char *)&local_238);
                        if ((int)uVar4 == 0) {
LAB_0010f4f1:
                          local_200 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                        }
                        else {
                          uVar4 = std::__cxx11::string::compare((char *)&local_238);
                          if ((int)uVar4 == 0) goto LAB_0010f4f1;
                          uVar4 = std::__cxx11::string::compare((char *)&local_238);
                          if ((int)uVar4 == 0) {
                            local_190 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)&local_238);
                            if (iVar3 == 0) {
                              iVar3 = std::__cxx11::string::compare((char *)&local_1c0);
                              if (iVar3 == 0) goto LAB_0010f442;
                            }
                            iVar3 = std::__cxx11::string::compare((char *)&local_238);
                            if (iVar3 == 0) {
                              uVar4 = std::__cxx11::string::compare((char *)&local_1c0);
                              if ((int)uVar4 == 0) {
                                local_198 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                goto LAB_0010f442;
                              }
                            }
                            iVar3 = std::__cxx11::string::compare((char *)&local_238);
                            if (iVar3 == 0) {
                              uVar4 = std::__cxx11::string::compare((char *)&local_1c0);
                              if ((int)uVar4 == 0) {
                                local_1a0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                goto LAB_0010f442;
                              }
                            }
                            iVar3 = std::__cxx11::string::compare((char *)&local_238);
                            if (iVar3 == 0) {
                              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_e8,"--random-seed","");
                              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_108,local_1c0,local_1c0 + local_1b8);
                              local_214 = seed(&local_e8,&local_108);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                                operator_delete(local_108._M_dataplus._M_p);
                              }
                              ptVar2 = &local_e8;
                              _Var7._M_p = local_e8._M_dataplus._M_p;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)&local_238);
                              if (iVar3 != 0) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(&local_50,"unrecognised option \'",&local_238);
                                std::operator+(&local_a8.first,&local_50,"\' (try option --help)");
                                std::runtime_error::runtime_error(this,(string *)&local_a8);
                                __cxa_throw(this,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_128,"--repeat","");
                              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_148,local_1c0,local_1c0 + local_1b8);
                              local_204 = repeat(&local_128,&local_148);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                operator_delete(local_148._M_dataplus._M_p);
                              }
                              ptVar2 = &local_128;
                              _Var7._M_p = local_128._M_dataplus._M_p;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)_Var7._M_p != &ptVar2->field_2) {
                              operator_delete(_Var7._M_p);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_0010f42d:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_168,&local_188);
      }
LAB_0010f442:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    uVar6 = 1;
    if ((local_1c8 & 1) == 0) {
      uVar6 = (undefined1)local_210;
    }
    uVar9 = (undefined1)local_190;
    uVar10 = (undefined1)local_1a0;
    uVar8 = (undefined1)local_198;
    __return_storage_ptr__ = local_150;
    iVar3 = local_204;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,&local_168);
  (__return_storage_ptr__->first).help = SUB81(local_1d0,0);
  (__return_storage_ptr__->first).abort = SUB81(local_1d8,0);
  (__return_storage_ptr__->first).count = SUB81(local_1e0,0);
  (__return_storage_ptr__->first).list = SUB81(local_1f0,0);
  (__return_storage_ptr__->first).tags = SUB81(local_1e8,0);
  (__return_storage_ptr__->first).time = SUB81(local_1f8,0);
  (__return_storage_ptr__->first).pass = (bool)uVar6;
  (__return_storage_ptr__->first).zen = SUB81(local_210,0);
  (__return_storage_ptr__->first).lexical = (bool)uVar8;
  (__return_storage_ptr__->first).random = (bool)uVar10;
  (__return_storage_ptr__->first).verbose = SUB81(local_200,0);
  (__return_storage_ptr__->first).version = (bool)uVar9;
  (__return_storage_ptr__->first).repeat = iVar3;
  (__return_storage_ptr__->first).seed = local_214;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}